

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aabb.h
# Opt level: O3

aabb * operator+(aabb *__return_storage_ptr__,aabb *bbox,vec3 *offset)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar2 = offset->e[0];
  dVar3 = offset->e[1];
  dVar4 = (bbox->x).max;
  dVar1 = offset->e[2];
  (__return_storage_ptr__->x).min = dVar2 + (bbox->x).min;
  (__return_storage_ptr__->x).max = dVar2 + dVar4;
  dVar2 = (bbox->y).max;
  (__return_storage_ptr__->y).min = dVar3 + (bbox->y).min;
  (__return_storage_ptr__->y).max = dVar3 + dVar2;
  dVar2 = (bbox->z).max;
  (__return_storage_ptr__->z).min = dVar1 + (bbox->z).min;
  (__return_storage_ptr__->z).max = dVar1 + dVar2;
  aabb::pad_to_minimums(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

aabb operator+(const aabb& bbox, const vec3& offset) {
    return aabb(bbox.x + offset.x(), bbox.y + offset.y(), bbox.z + offset.z());
}